

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGrow *curr)

{
  char *pcVar1;
  undefined8 uVar2;
  char cVar3;
  uint x;
  uint uVar4;
  Literal *pLVar5;
  long lVar6;
  Flow *this_00;
  Name NVar7;
  undefined1 local_1a8 [8];
  Flow ret;
  Flow valueFlow;
  Flow fail;
  Flow deltaFlow;
  TableInterfaceInfo info;
  Literal local_58;
  undefined8 local_40;
  char *local_38;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&ret.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x20));
  if (valueFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&fail.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x28));
    if (deltaFlow.breakTo.super_IString.str._M_len == 0) {
      pcVar1 = *(char **)(curr + 0x10);
      uVar2 = *(undefined8 *)(curr + 0x18);
      getTableInterfaceInfo
                ((TableInterfaceInfo *)&deltaFlow.breakTo.super_IString.str._M_str,this,
                 (Name)*(string_view *)(curr + 0x10));
      local_40 = uVar2;
      x = (**(code **)(*(long *)deltaFlow.breakTo.super_IString.str._M_str + 0xd8))
                    (deltaFlow.breakTo.super_IString.str._M_str,pcVar1,uVar2);
      Literal::makeFromInt32((Literal *)&info.name.super_IString.str._M_str,x,(Type)0x2);
      Flow::Flow((Flow *)local_1a8,(Literal *)&info.name.super_IString.str._M_str);
      ::wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
      Literal::makeFromInt32(&local_58,-1,(Type)0x2);
      this_00 = (Flow *)&valueFlow.breakTo.super_IString.str._M_str;
      local_38 = pcVar1;
      Flow::Flow(this_00,&local_58);
      ::wasm::Literal::~Literal(&local_58);
      pLVar5 = Flow::getSingleValue((Flow *)&fail.breakTo.super_IString.str._M_str);
      uVar4 = Literal::geti32(pLVar5);
      if (x < ~uVar4) {
        NVar7.super_IString.str._M_str = local_38;
        NVar7.super_IString.str._M_len = (size_t)this->wasm;
        lVar6 = ::wasm::Module::getTable(NVar7);
        if (*(ulong *)(lVar6 + 0x40) < (ulong)uVar4 + (ulong)x) {
          Flow::Flow(__return_storage_ptr__,(Flow *)&valueFlow.breakTo.super_IString.str._M_str);
        }
        else {
          pLVar5 = Flow::getSingleValue((Flow *)&ret.breakTo.super_IString.str._M_str);
          cVar3 = (**(code **)(*(long *)deltaFlow.breakTo.super_IString.str._M_str + 0x38))
                            (deltaFlow.breakTo.super_IString.str._M_str,local_38,local_40,pLVar5,x,
                             uVar4 + x);
          if (cVar3 != '\0') {
            this_00 = (Flow *)local_1a8;
          }
          Flow::Flow(__return_storage_ptr__,this_00);
        }
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&valueFlow.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&valueFlow.breakTo.super_IString.str._M_str);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_1a8);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&fail.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&fail.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&ret.breakTo.super_IString.str._M_str);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&ret.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGrow(TableGrow* curr) {
    NOTE_ENTER("TableGrow");
    Flow valueFlow = self()->visit(curr->value);
    if (valueFlow.breaking()) {
      return valueFlow;
    }
    Flow deltaFlow = self()->visit(curr->delta);
    if (deltaFlow.breaking()) {
      return deltaFlow;
    }
    Name tableName = curr->table;
    auto info = getTableInterfaceInfo(tableName);

    Index tableSize = info.interface->tableSize(tableName);
    Flow ret = Literal::makeFromInt32(tableSize, Type::i32);
    Flow fail = Literal::makeFromInt32(-1, Type::i32);
    Index delta = deltaFlow.getSingleValue().geti32();

    if (tableSize >= uint32_t(-1) - delta) {
      return fail;
    }
    auto maxTableSize = self()->wasm.getTable(tableName)->max;
    if (uint64_t(tableSize) + uint64_t(delta) > uint64_t(maxTableSize)) {
      return fail;
    }
    Index newSize = tableSize + delta;
    if (!info.interface->growTable(
          tableName, valueFlow.getSingleValue(), tableSize, newSize)) {
      // We failed to grow the table in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    return ret;
  }